

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

void m68k_cpu_transaction_failed_m68k
               (CPUState *cs,hwaddr physaddr,vaddr addr,uint size,MMUAccessType access_type,
               int mmu_idx,MemTxAttrs attrs,MemTxResult response,uintptr_t retaddr)

{
  int iVar1;
  CPUM68KState_conflict *env;
  M68kCPU *cpu;
  int mmu_idx_local;
  MMUAccessType access_type_local;
  uint size_local;
  vaddr addr_local;
  hwaddr physaddr_local;
  CPUState *cs_local;
  MemTxAttrs attrs_local;
  
  cpu_restore_state_m68k(cs,retaddr,true);
  iVar1 = m68k_feature((CPUM68KState_conflict *)(cs[1].tb_jmp_cache + 0x8f),3);
  if (iVar1 == 0) {
    return;
  }
  *(undefined4 *)(cs[1].tb_jmp_cache + 0xbc) = 0;
  *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) | 0x400;
  *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) =
       *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) & 0xfffffff8;
  if ((*(uint *)((long)cs[1].tb_jmp_cache + 0x4bc) & 0x2000) != 0) {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) | 4;
  }
  if (access_type == MMU_INST_FETCH) {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) | 2;
  }
  else {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) | 1;
  }
  *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) =
       *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) & 0xffffff9f;
  if (size == 1) {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) | 0x20
    ;
  }
  else if (size == 2) {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) = *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) | 0x40
    ;
  }
  else if (size == 4) {
    *(undefined4 *)((long)cs[1].tb_jmp_cache + 0x5bc) =
         *(undefined4 *)((long)cs[1].tb_jmp_cache + 0x5bc);
  }
  if (access_type != MMU_DATA_STORE) {
    *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) =
         *(uint *)((long)cs[1].tb_jmp_cache + 0x5bc) | 0x100;
  }
  *(int *)(cs[1].tb_jmp_cache + 0xb7) = (int)addr;
  cs->exception_index = 2;
  cpu_loop_exit_m68k(cs);
}

Assistant:

void m68k_cpu_transaction_failed(CPUState *cs, hwaddr physaddr, vaddr addr,
                                 unsigned size, MMUAccessType access_type,
                                 int mmu_idx, MemTxAttrs attrs,
                                 MemTxResult response, uintptr_t retaddr)
{
    M68kCPU *cpu = M68K_CPU(cs);
    CPUM68KState *env = &cpu->env;

    cpu_restore_state(cs, retaddr, true);

    if (m68k_feature(env, M68K_FEATURE_M68040)) {
        env->mmu.mmusr = 0;
        env->mmu.ssw |= M68K_ATC_040;
        /* FIXME: manage MMU table access error */
        env->mmu.ssw &= ~M68K_TM_040;
        if (env->sr & SR_S) { /* SUPERVISOR */
            env->mmu.ssw |= M68K_TM_040_SUPER;
        }
        if (access_type == MMU_INST_FETCH) { /* instruction or data */
            env->mmu.ssw |= M68K_TM_040_CODE;
        } else {
            env->mmu.ssw |= M68K_TM_040_DATA;
        }
        env->mmu.ssw &= ~M68K_BA_SIZE_MASK;
        switch (size) {
        case 1:
            env->mmu.ssw |= M68K_BA_SIZE_BYTE;
            break;
        case 2:
            env->mmu.ssw |= M68K_BA_SIZE_WORD;
            break;
        case 4:
            env->mmu.ssw |= M68K_BA_SIZE_LONG;
            break;
        }

        if (access_type != MMU_DATA_STORE) {
            env->mmu.ssw |= M68K_RW_040;
        }

        env->mmu.ar = addr;

        cs->exception_index = EXCP_ACCESS;
        cpu_loop_exit(cs);
    }
}